

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_plastic.hpp
# Opt level: O0

Color __thiscall RoughPlasticBSDF::f(RoughPlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  Color CVar3;
  vec3f wo_00;
  undefined8 *in_RCX;
  vec3f *in_RDX;
  long in_RDI;
  float fVar4;
  undefined8 extraout_XMM0_Qb;
  vec3f vVar5;
  vec3f vVar6;
  vec3f refl;
  Color Fres;
  float cos;
  vec3f wm;
  vec3f diff;
  float ratio2;
  float cost;
  float sint;
  float energy;
  undefined8 in_stack_fffffffffffffd60;
  vec3f *this_00;
  vec3f *this_01;
  undefined4 in_stack_fffffffffffffd70;
  float p;
  vec3f local_250 [3];
  float alpha;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe2c;
  vec3f local_180;
  float local_174;
  vec3f local_170;
  vec3f local_160;
  undefined8 local_150;
  float local_148;
  vec3f local_140;
  vec3f local_130;
  vec3f local_120;
  vec3f local_110;
  undefined8 local_100;
  float local_f8;
  vec3f local_f0;
  vec3f local_e0;
  vec3f local_d0;
  undefined8 local_c0;
  float local_b8;
  vec3f local_b4;
  undefined8 local_a8;
  float local_a0;
  vec3f local_9c;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  undefined8 *local_30;
  vec3f *local_28;
  vec3f local_c;
  
  alpha = (float)((ulong)stack0xfffffffffffffdd0 >> 0x20);
  local_34 = 1.0;
  local_30 = in_RCX;
  local_28 = in_RDX;
  fVar4 = DielectricBRDF::reflectivity
                    ((float)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                     (float)in_stack_fffffffffffffd60);
  local_34 = (1.0 - fVar4) * local_34;
  local_38 = sqrtf(-*(float *)(local_30 + 1) * *(float *)(local_30 + 1) + 1.0);
  local_38 = local_38 / *(float *)(in_RDI + 0x24);
  if (local_38 < 1.0) {
    p = 1.0;
    local_3c = sqrtf(1.0 - local_38 * local_38);
    fVar4 = DielectricBRDF::reflectivity
                      ((float)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                       (float)in_stack_fffffffffffffd60);
    local_34 = local_34 * (p - fVar4);
    local_40 = p / (*(float *)(in_RDI + 0x24) * *(float *)(in_RDI + 0x24));
    this_01 = &local_9c;
    vec3f::vec3f(this_01,local_34);
    this_00 = &local_b4;
    vec3f::vec3f(this_00,p);
    vVar5 = ::operator*((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70),
                        (float)((ulong)this_01 >> 0x20));
    local_d0.z = vVar5.z;
    local_b8 = local_d0.z;
    local_d0._0_8_ = vVar5._0_8_;
    local_c0._0_4_ = local_d0.x;
    local_c0._4_4_ = local_d0.y;
    local_d0 = vVar5;
    vVar5 = ::operator-((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70),this_01);
    local_e0.z = vVar5.z;
    local_a0 = local_e0.z;
    local_e0._0_8_ = vVar5._0_8_;
    local_a8._0_4_ = local_e0.x;
    local_a8._4_4_ = local_e0.y;
    local_e0 = vVar5;
    vVar5 = operator/((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70),this_01);
    local_f0.z = vVar5.z;
    local_88 = local_f0.z;
    local_f0._0_8_ = vVar5._0_8_;
    local_90._0_4_ = local_f0.x;
    local_90._4_4_ = local_f0.y;
    local_f0 = vVar5;
    vVar5 = ::operator*((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70),
                        (float)((ulong)this_01 >> 0x20));
    local_f8 = vVar5.z;
    local_100 = vVar5._0_8_;
    auVar2._8_4_ = (int)extraout_XMM0_Qb;
    auVar2._0_8_ = local_100;
    auVar2._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    vVar5 = auVar2._4_12_;
    local_80 = local_100;
    local_78 = local_f8;
    vVar6 = ::operator*((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70),
                        (float)((ulong)this_01 >> 0x20));
    local_110.z = vVar6.z;
    local_68 = local_110.z;
    local_110._0_8_ = vVar6._0_8_;
    local_70._0_4_ = local_110.x;
    local_70._4_4_ = local_110.y;
    local_110 = vVar6;
    vVar6 = operator/((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70),(float)((ulong)this_01 >> 0x20)
                     );
    local_120.z = vVar6.z;
    local_58 = local_120.z;
    local_120._0_8_ = vVar6._0_8_;
    local_60._0_4_ = local_120.x;
    local_60._4_4_ = local_120.y;
    local_120 = vVar6;
    vVar6 = ::operator*((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70),this_01);
    local_130.z = vVar6.z;
    local_48 = local_130.z;
    local_130._0_8_ = vVar6._0_8_;
    local_50._0_4_ = local_130.x;
    local_50._4_4_ = local_130.y;
    local_130 = vVar6;
    vVar6 = ::operator+((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70),this_01);
    local_160.z = vVar6.z;
    local_148 = local_160.z;
    local_160._0_8_ = vVar6._0_8_;
    local_150._0_4_ = local_160.x;
    local_150._4_4_ = local_160.y;
    local_160 = vVar6;
    vVar6 = normalized((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70));
    local_170.z = vVar6.z;
    local_140.z = local_170.z;
    local_170._0_8_ = vVar6._0_8_;
    local_140.x = local_170.x;
    local_140.y = local_170.y;
    local_170 = vVar6;
    local_174 = dot(&local_140,local_28);
    fVar4 = DielectricBRDF::reflectivity((float)((ulong)this_00 >> 0x20),SUB84(this_00,0));
    vec3f::vec3f(&local_180,fVar4);
    EDX::GGX_D(vVar5,SUB84(this_01,0));
    uVar1 = local_28->x;
    wo_00.y = (float)in_stack_fffffffffffffe2c;
    wo_00.x = local_140.z;
    wo_00.z = (float)*local_30;
    vVar6.y = (float)in_stack_fffffffffffffe0c;
    vVar6.x = (float)*(undefined4 *)(local_30 + 1);
    vVar6.z = (float)uVar1;
    vVar5.y = (float)in_stack_fffffffffffffdec;
    vVar5.x = (float)in_stack_fffffffffffffde8;
    vVar5.z = local_140.x;
    EDX::Smith_G(wo_00,vVar6,vVar5,alpha);
    ::operator*(SUB84(this_01,0),this_00);
    ::operator*((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70),this_01);
    vVar5 = ::operator+((vec3f *)CONCAT44(p,in_stack_fffffffffffffd70),this_01);
    local_250[0]._0_8_ = vVar5._0_8_;
    local_c.x = local_250[0].x;
    local_c.y = local_250[0].y;
    local_250[0].z = vVar5.z;
    local_c.z = local_250[0].z;
  }
  else {
    vec3f::vec3f(&local_c,0.0);
  }
  CVar3.z = local_c.z;
  CVar3.x = local_c.x;
  CVar3.y = local_c.y;
  return CVar3;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const
	{
		float energy = 1;
		energy *= 1 - DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		float sint = sqrtf(1-wi.z*wi.z)/IOR;
		if (sint >= 1) return 0; // total reflect (shouldn't happen if IOR>1)
		float cost = sqrtf(1-sint*sint);
		energy *= 1 - DielectricBRDF::reflectivity(cost, 1/IOR);
		float ratio2 = 1/(IOR*IOR); // see note_refract_radiance
		vec3f diff = energy / (1 - albedo * (1-outRatio)) * ratio2 * 1/PI * albedo;
		// add reflect component
		vec3f wm = normalized(wo+wi); // microfacet normal
		float cos = dot(wm,wo);
		Color Fres = DielectricBRDF::reflectivity(cos, IOR); // reflected energy
		vec3f refl = EDX::GGX_D(wm,alpha) * EDX::Smith_G(wo,wi,wm,alpha) / (4 * wo.z * wi.z) * Fres;
		// console.log(refl, diff);
		return refl * Ks + diff;
	}